

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printManifest(char *fileName)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  Header *pHVar5;
  CompressedIDManifest *pCVar6;
  MultiPartInputFile in;
  IDManifest local_48 [24];
  
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(&in,fileName,iVar2,true);
  iVar2 = 0;
  while( true ) {
    iVar3 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar3 <= iVar2) break;
    iVar3 = Imf_3_4::MultiPartInputFile::parts();
    if (1 < iVar3) {
      poVar4 = std::operator<<((ostream *)&std::cout,fileName);
      poVar4 = std::operator<<(poVar4," part ");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar2);
      std::operator<<(poVar4,":\n");
    }
    iVar3 = (int)&in;
    pHVar5 = (Header *)Imf_3_4::MultiPartInputFile::header(iVar3);
    cVar1 = Imf_3_4::hasIDManifest(pHVar5);
    if (cVar1 == '\0') {
      std::operator<<((ostream *)&std::cout,"no manifest found\n");
    }
    else {
      pHVar5 = (Header *)Imf_3_4::MultiPartInputFile::header(iVar3);
      pCVar6 = (CompressedIDManifest *)Imf_3_4::idManifest(pHVar5);
      Imf_3_4::IDManifest::IDManifest(local_48,pCVar6);
      dumpManifest(local_48);
      std::
      vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
      ::~vector((vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                 *)local_48);
      poVar4 = std::operator<<((ostream *)&std::cout,"raw text size    : ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"uncompressed size: ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"compressed size  : ");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,*(int *)pCVar6);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    iVar2 = iVar2 + 1;
  }
  Imf_3_4::MultiPartInputFile::~MultiPartInputFile(&in);
  return;
}

Assistant:

void
printManifest (const char fileName[])
{

    MultiPartInputFile in (fileName);
    //
    // extract objectID attribute
    //

    for (int part = 0; part < in.parts (); part++)
    {
        if (in.parts () > 1) { cout << fileName << " part " << part << ":\n"; }
        if (hasIDManifest (in.header (part)))
        {
            const OPENEXR_IMF_NAMESPACE::CompressedIDManifest& mfst =
                idManifest (in.header (part));
            size_t size = dumpManifest (mfst);
            cout << "raw text size    : " << size << endl;
            cout << "uncompressed size: " << mfst._uncompressedDataSize << endl;
            cout << "compressed size  : " << mfst._compressedDataSize << endl;
        }
        else { cout << "no manifest found\n"; }
    }
}